

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O0

Label * labelling::getNextLabel
                  (vector<labelling::Label,_std::allocator<labelling::Label>_> *labels_ptr,
                  Directions *direction)

{
  iterator iVar1;
  iterator iVar2;
  int *in_RDX;
  Label *in_RDI;
  Label *next_label;
  Label *pLVar3;
  iterator in_stack_ffffffffffffffc8;
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  in_stack_ffffffffffffffd0;
  
  pLVar3 = in_RDI;
  if (*in_RDX == 0) {
    iVar1 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::begin(in_RDI);
    iVar2 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::end(in_RDI);
    std::
    pop_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,std::greater<void>>
              (iVar1._M_current,iVar2._M_current);
  }
  else {
    in_stack_ffffffffffffffc8 =
         std::vector<labelling::Label,_std::allocator<labelling::Label>_>::begin(in_RDI);
    std::vector<labelling::Label,_std::allocator<labelling::Label>_>::end
              ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)in_RDI);
    std::
    pop_heap<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>>
              (in_stack_ffffffffffffffd0,
               (__normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                )in_stack_ffffffffffffffc8._M_current);
  }
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::back
            ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)pLVar3);
  Label::Label(in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffc8._M_current);
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::pop_back
            ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)0x2ba2aa);
  return pLVar3;
}

Assistant:

Label getNextLabel(
    std::vector<Label>*              labels_ptr,
    const bidirectional::Directions& direction) {
  if (direction == bidirectional::FWD)
    std::pop_heap(labels_ptr->begin(), labels_ptr->end(), std::greater<>{});
  else
    std::pop_heap(labels_ptr->begin(), labels_ptr->end());

  // Get next label as the back of the heap
  Label next_label = labels_ptr->back();
  labels_ptr->pop_back();
  return next_label;
}